

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

lysp_node_notif * lysp_node_notifs(lysp_node *node)

{
  lysp_node_notif **pplVar1;
  lysp_node_notif *plVar2;
  
  pplVar1 = lysp_node_notifs_p(node);
  if (pplVar1 == (lysp_node_notif **)0x0) {
    plVar2 = (lysp_node_notif *)0x0;
  }
  else {
    plVar2 = *pplVar1;
  }
  return plVar2;
}

Assistant:

lysp_node_notif *
lysp_node_notifs(const struct lysp_node *node)
{
    struct lysp_node_notif **notifs;

    notifs = lysp_node_notifs_p((struct lysp_node *)node);
    if (notifs) {
        return *notifs;
    } else {
        return NULL;
    }
}